

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O2

string * __thiscall
TreeIncPruneBGPlanner::SoftPrintJpol_abi_cxx11_
          (string *__return_storage_ptr__,TreeIncPruneBGPlanner *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  pointer pvVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    if (((long)(jpol->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(jpol->
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x18 == uVar4) break;
    std::operator<<(local_1a8,"[");
    uVar5 = 0;
    while( true ) {
      pvVar1 = (jpol->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[uVar4].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      if ((long)*(pointer *)
                 ((long)&pvVar1[uVar4].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8) - lVar2 >> 2 == (ulong)uVar5) break;
      if (*(int *)(lVar2 + (ulong)uVar5 * 4) == -1) {
        std::operator<<(local_1a8,"U");
      }
      else {
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      uVar5 = uVar5 + 1;
    }
    std::operator<<(local_1a8,"]");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string TreeIncPruneBGPlanner::SoftPrintJpol(
    const vector<vector<Index> > &jpol) const
{
    stringstream ss;
    for(Index k=0;k!=jpol.size();++k)
    {
        ss << "[";
        for(Index o=0;o!=jpol[k].size();++o)
        {
            if(jpol[k][o]==UNSPECIFIED_ACTION)
                ss << "U";
            else
                ss << jpol[k][o];
        }
        ss << "]";
    }
    
    return(ss.str());
}